

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<tm>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  undefined8 this;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx_00;
  iterator it;
  iterator it_00;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  type f;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *ctx_local;
  void *arg_local;
  
  f.tm_format._528_8_ = ctx;
  formatter<tm,_char,_void>::formatter((formatter<tm,_char,_void> *)&parse_ctx);
  ctx_00 = context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ::parse_context((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                            *)f.tm_format._528_8_);
  it = formatter<tm,char,void>::
       parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
                 ((formatter<tm,char,void> *)&parse_ctx,ctx_00);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to(ctx_00,it);
  this = f.tm_format._528_8_;
  it_00 = formatter<tm,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<tm,char,void> *)&parse_ctx,(tm *)arg,
                     (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                      *)f.tm_format._528_8_);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                *)this,it_00);
  formatter<tm,_char,_void>::~formatter((formatter<tm,_char,_void> *)&parse_ctx);
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }